

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef rec_mm_arith(jit_State *J,RecordIndex *ix,MMS mm)

{
  BCReg func_00;
  int iVar1;
  TRef *pTVar2;
  TValue *pTVar3;
  code *cont;
  TValue *basev;
  TRef *base;
  BCReg func;
  MMS mm_local;
  RecordIndex *ix_local;
  jit_State *J_local;
  
  cont = lj_cont_ra;
  if (mm == MM_concat) {
    cont = lj_cont_cat;
  }
  func_00 = rec_mm_prep(J,cont);
  pTVar2 = J->base + func_00;
  pTVar3 = J->L->base + func_00;
  pTVar2[2] = ix->tab;
  pTVar2[3] = ix->key;
  pTVar3[2].gcr.gcptr64 = (uint64_t)ix->tabv;
  pTVar3[3] = ix->keyv;
  iVar1 = lj_record_mm_lookup(J,ix,mm);
  if (iVar1 != 0) {
LAB_00199a03:
    *pTVar2 = ix->mobj;
    pTVar2[1] = 0;
    *pTVar3 = ix->mobjv;
    lj_record_call(J,func_00,2);
    return 0;
  }
  if (mm != MM_unm) {
    ix->tab = ix->key;
    ix->tabv = ix->keyv;
    iVar1 = lj_record_mm_lookup(J,ix,mm);
    if (iVar1 != 0) goto LAB_00199a03;
  }
  lj_trace_err(J,LJ_TRERR_NOMM);
}

Assistant:

static TRef rec_mm_arith(jit_State *J, RecordIndex *ix, MMS mm)
{
  /* Set up metamethod call first to save ix->tab and ix->tabv. */
  BCReg func = rec_mm_prep(J, mm == MM_concat ? lj_cont_cat : lj_cont_ra);
  TRef *base = J->base + func;
  TValue *basev = J->L->base + func;
  base[1+LJ_FR2] = ix->tab; base[2+LJ_FR2] = ix->key;
  copyTV(J->L, basev+1+LJ_FR2, &ix->tabv);
  copyTV(J->L, basev+2+LJ_FR2, &ix->keyv);
  if (!lj_record_mm_lookup(J, ix, mm)) {  /* Lookup mm on 1st operand. */
    if (mm != MM_unm) {
      ix->tab = ix->key;
      copyTV(J->L, &ix->tabv, &ix->keyv);
      if (lj_record_mm_lookup(J, ix, mm))  /* Lookup mm on 2nd operand. */
	goto ok;
    }
    lj_trace_err(J, LJ_TRERR_NOMM);
  }
ok:
  base[0] = ix->mobj;
#if LJ_FR2
  base[1] = 0;
#endif
  copyTV(J->L, basev+0, &ix->mobjv);
  lj_record_call(J, func, 2);
  return 0;  /* No result yet. */
}